

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

bool vkt::sparse::checkSparseSupportForImageType
               (InstanceInterface *instance,VkPhysicalDevice physicalDevice,ImageType imageType)

{
  VkImageType VVar1;
  undefined1 local_100 [8];
  VkPhysicalDeviceFeatures deviceFeatures;
  ImageType imageType_local;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *instance_local;
  
  deviceFeatures.variableMultisampleRate = imageType;
  unique0x10000052 = physicalDevice;
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)local_100,instance,physicalDevice);
  if (deviceFeatures.shaderResourceResidency == 0) {
    instance_local._7_1_ = false;
  }
  else {
    VVar1 = mapImageType(deviceFeatures.variableMultisampleRate);
    if (VVar1 == VK_IMAGE_TYPE_2D) {
      instance_local._7_1_ = deviceFeatures.sparseBinding == 1;
    }
    else if (VVar1 == VK_IMAGE_TYPE_3D) {
      instance_local._7_1_ = deviceFeatures.sparseResidencyBuffer == 1;
    }
    else {
      instance_local._7_1_ = false;
    }
  }
  return instance_local._7_1_;
}

Assistant:

bool checkSparseSupportForImageType (const InstanceInterface&	instance,
									 const VkPhysicalDevice		physicalDevice,
									 const ImageType			imageType)
{
	const VkPhysicalDeviceFeatures deviceFeatures = getPhysicalDeviceFeatures(instance, physicalDevice);

	if (!deviceFeatures.sparseBinding)
		return false;

	switch (mapImageType(imageType))
	{
		case VK_IMAGE_TYPE_2D:
			return deviceFeatures.sparseResidencyImage2D == VK_TRUE;
		case VK_IMAGE_TYPE_3D:
			return deviceFeatures.sparseResidencyImage3D == VK_TRUE;
		default:
			DE_ASSERT(0);
			return false;
	};
}